

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O1

KeyData * cfd::capi::ParsePubkey
                    (KeyData *__return_storage_ptr__,int kind,char *pubkey,NetType net_type)

{
  void *pvVar1;
  pointer puVar2;
  pointer puVar3;
  NetType NVar4;
  CfdException *pCVar5;
  string pubkey_str;
  undefined1 local_258 [32];
  pointer puStack_238;
  pointer local_230;
  pointer local_228;
  pointer local_220;
  pointer puStack_218;
  pointer local_210;
  pointer local_208;
  pointer puStack_200;
  pointer local_1f8;
  pointer puStack_1f0;
  pointer local_1e8;
  pointer local_1e0;
  pointer puStack_1d8;
  pointer local_1d0;
  bool local_1c8;
  undefined3 uStack_1c7;
  NetType NStack_1c4;
  pointer local_1c0;
  pointer puStack_1b8;
  pointer local_1b0;
  pointer local_1a8;
  pointer puStack_1a0;
  pointer local_198;
  uint32_t local_190;
  uint32_t uStack_18c;
  uint8_t uStack_188;
  undefined3 uStack_187;
  uint32_t uStack_184;
  pointer local_180;
  pointer puStack_178;
  pointer local_170;
  pointer local_168;
  pointer puStack_160;
  pointer local_158;
  pointer local_150;
  pointer puStack_148;
  pointer local_140;
  pointer local_138;
  pointer puStack_130;
  pointer local_128;
  pointer local_120;
  pointer puStack_118;
  pointer local_110;
  ByteData local_108;
  string local_f0;
  string local_d0;
  ByteData local_b0;
  ExtPubkey local_98;
  
  std::__cxx11::string::string((string *)&local_d0,pubkey,(allocator *)local_258);
  if ((kind != 4) != (local_d0._M_string_length == 0x42)) {
    local_258._0_8_ = "cfdcapi_psbt.cpp";
    local_258._8_4_ = 0xa5;
    local_258._16_8_ = "ParsePubkey";
    core::logger::log<>((CfdSourceLocation *)local_258,kCfdLogLevelWarning,"unmatch pubkey type.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_258._0_8_ = local_258 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_258,"Failed to parameter. unmatch pubkey type.","");
    core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_258);
    __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (local_d0._M_string_length == 0x42) {
    core::KeyData::KeyData(__return_storage_ptr__,&local_d0,-1,false);
  }
  else {
    core::KeyData::KeyData(__return_storage_ptr__);
    if (local_d0._M_string_length == 0x9c) {
      core::ByteData::ByteData(&local_108,&local_d0);
      core::ExtPubkey::ExtPubkey(&local_98,&local_108);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
      core::ByteData::ByteData(&local_b0);
      core::KeyData::KeyData((KeyData *)local_258,&local_98,&local_f0,&local_b0);
      pvVar1 = (__return_storage_ptr__->pubkey_).data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->pubkey_).data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_258._0_8_;
      (__return_storage_ptr__->pubkey_).data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_258._8_8_;
      (__return_storage_ptr__->pubkey_).data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_258._16_8_;
      local_258._0_8_ = (pointer)0x0;
      local_258._8_8_ = (pointer)0x0;
      local_258._16_8_ = (pointer)0x0;
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1);
      }
      puVar2 = (__return_storage_ptr__->privkey_).data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->privkey_).data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_258._24_8_;
      (__return_storage_ptr__->privkey_).data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_238;
      (__return_storage_ptr__->privkey_).data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_230;
      local_258._24_8_ = (pointer)0x0;
      puStack_238 = (pointer)0x0;
      local_230 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      *(pointer *)&(__return_storage_ptr__->privkey_).is_compressed_ = local_228;
      puVar2 = (__return_storage_ptr__->extprivkey_).serialize_data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->extprivkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_220;
      (__return_storage_ptr__->extprivkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_218;
      (__return_storage_ptr__->extprivkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_210;
      local_220 = (pointer)0x0;
      puStack_218 = (pointer)0x0;
      local_210 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      *(pointer *)&(__return_storage_ptr__->extprivkey_).version_ = local_208;
      *(pointer *)&(__return_storage_ptr__->extprivkey_).depth_ = puStack_200;
      puVar2 = (__return_storage_ptr__->extprivkey_).chaincode_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->extprivkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_1f8;
      (__return_storage_ptr__->extprivkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_1f0;
      (__return_storage_ptr__->extprivkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_1e8;
      local_1f8 = (pointer)0x0;
      puStack_1f0 = (pointer)0x0;
      local_1e8 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      puVar2 = (__return_storage_ptr__->extprivkey_).privkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->extprivkey_).privkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_1e0;
      *(pointer *)
       ((long)&(__return_storage_ptr__->extprivkey_).privkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 8) = puStack_1d8;
      *(pointer *)
       ((long)&(__return_storage_ptr__->extprivkey_).privkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 0x10) = local_1d0;
      local_1e0 = (pointer)0x0;
      puStack_1d8 = (pointer)0x0;
      local_1d0 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      (__return_storage_ptr__->extprivkey_).privkey_.is_compressed_ = local_1c8;
      *(undefined3 *)&(__return_storage_ptr__->extprivkey_).privkey_.field_0x19 = uStack_1c7;
      (__return_storage_ptr__->extprivkey_).privkey_.net_type_ = NStack_1c4;
      puVar2 = (__return_storage_ptr__->extprivkey_).tweak_sum_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->extprivkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_1c0;
      (__return_storage_ptr__->extprivkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_1b8;
      (__return_storage_ptr__->extprivkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_1b0;
      local_1c0 = (pointer)0x0;
      puStack_1b8 = (pointer)0x0;
      local_1b0 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      puVar2 = (__return_storage_ptr__->extpubkey_).serialize_data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->extpubkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_1a8;
      (__return_storage_ptr__->extpubkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_1a0;
      (__return_storage_ptr__->extpubkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_198;
      local_1a8 = (pointer)0x0;
      puStack_1a0 = (pointer)0x0;
      local_198 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      (__return_storage_ptr__->extpubkey_).version_ = local_190;
      (__return_storage_ptr__->extpubkey_).fingerprint_ = uStack_18c;
      (__return_storage_ptr__->extpubkey_).depth_ = uStack_188;
      *(undefined3 *)&(__return_storage_ptr__->extpubkey_).field_0x21 = uStack_187;
      (__return_storage_ptr__->extpubkey_).child_num_ = uStack_184;
      puVar2 = (__return_storage_ptr__->extpubkey_).chaincode_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->extpubkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_180;
      (__return_storage_ptr__->extpubkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_178;
      (__return_storage_ptr__->extpubkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_170;
      local_180 = (pointer)0x0;
      puStack_178 = (pointer)0x0;
      local_170 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      puVar2 = (__return_storage_ptr__->extpubkey_).pubkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->extpubkey_).pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_168;
      *(pointer *)
       ((long)&(__return_storage_ptr__->extpubkey_).pubkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 8) = puStack_160;
      *(pointer *)
       ((long)&(__return_storage_ptr__->extpubkey_).pubkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 0x10) = local_158;
      local_168 = (pointer)0x0;
      puStack_160 = (pointer)0x0;
      local_158 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      puVar2 = (__return_storage_ptr__->extpubkey_).tweak_sum_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->extpubkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_150;
      (__return_storage_ptr__->extpubkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_148;
      (__return_storage_ptr__->extpubkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_140;
      local_150 = (pointer)0x0;
      puStack_148 = (pointer)0x0;
      local_140 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      puVar3 = (__return_storage_ptr__->path_).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->path_).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = local_138;
      (__return_storage_ptr__->path_).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_130;
      (__return_storage_ptr__->path_).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_128;
      local_138 = (pointer)0x0;
      puStack_130 = (pointer)0x0;
      local_128 = (pointer)0x0;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
      }
      puVar2 = (__return_storage_ptr__->fingerprint_).data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->fingerprint_).data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_120;
      (__return_storage_ptr__->fingerprint_).data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_118;
      (__return_storage_ptr__->fingerprint_).data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_110;
      local_120 = (pointer)0x0;
      puStack_118 = (pointer)0x0;
      local_110 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      core::KeyData::~KeyData((KeyData *)local_258);
      if (local_b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if (local_98.tweak_sum_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.tweak_sum_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_98.pubkey_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.pubkey_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_98.chaincode_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.chaincode_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_98.serialize_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.serialize_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    else {
      core::ExtPubkey::ExtPubkey(&local_98,&local_d0);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
      core::ByteData::ByteData(&local_108);
      core::KeyData::KeyData((KeyData *)local_258,&local_98,&local_f0,&local_108);
      pvVar1 = (__return_storage_ptr__->pubkey_).data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->pubkey_).data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_258._0_8_;
      (__return_storage_ptr__->pubkey_).data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_258._8_8_;
      (__return_storage_ptr__->pubkey_).data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_258._16_8_;
      local_258._0_8_ = (pointer)0x0;
      local_258._8_8_ = (pointer)0x0;
      local_258._16_8_ = (pointer)0x0;
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1);
      }
      puVar2 = (__return_storage_ptr__->privkey_).data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->privkey_).data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_258._24_8_;
      (__return_storage_ptr__->privkey_).data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_238;
      (__return_storage_ptr__->privkey_).data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_230;
      local_258._24_8_ = (pointer)0x0;
      puStack_238 = (pointer)0x0;
      local_230 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      *(pointer *)&(__return_storage_ptr__->privkey_).is_compressed_ = local_228;
      puVar2 = (__return_storage_ptr__->extprivkey_).serialize_data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->extprivkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_220;
      (__return_storage_ptr__->extprivkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_218;
      (__return_storage_ptr__->extprivkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_210;
      local_220 = (pointer)0x0;
      puStack_218 = (pointer)0x0;
      local_210 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      *(pointer *)&(__return_storage_ptr__->extprivkey_).version_ = local_208;
      *(pointer *)&(__return_storage_ptr__->extprivkey_).depth_ = puStack_200;
      puVar2 = (__return_storage_ptr__->extprivkey_).chaincode_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->extprivkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_1f8;
      (__return_storage_ptr__->extprivkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_1f0;
      (__return_storage_ptr__->extprivkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_1e8;
      local_1f8 = (pointer)0x0;
      puStack_1f0 = (pointer)0x0;
      local_1e8 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      puVar2 = (__return_storage_ptr__->extprivkey_).privkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->extprivkey_).privkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_1e0;
      *(pointer *)
       ((long)&(__return_storage_ptr__->extprivkey_).privkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 8) = puStack_1d8;
      *(pointer *)
       ((long)&(__return_storage_ptr__->extprivkey_).privkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 0x10) = local_1d0;
      local_1e0 = (pointer)0x0;
      puStack_1d8 = (pointer)0x0;
      local_1d0 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      (__return_storage_ptr__->extprivkey_).privkey_.is_compressed_ = local_1c8;
      *(undefined3 *)&(__return_storage_ptr__->extprivkey_).privkey_.field_0x19 = uStack_1c7;
      (__return_storage_ptr__->extprivkey_).privkey_.net_type_ = NStack_1c4;
      puVar2 = (__return_storage_ptr__->extprivkey_).tweak_sum_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->extprivkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_1c0;
      (__return_storage_ptr__->extprivkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_1b8;
      (__return_storage_ptr__->extprivkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_1b0;
      local_1c0 = (pointer)0x0;
      puStack_1b8 = (pointer)0x0;
      local_1b0 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      puVar2 = (__return_storage_ptr__->extpubkey_).serialize_data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->extpubkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_1a8;
      (__return_storage_ptr__->extpubkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_1a0;
      (__return_storage_ptr__->extpubkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_198;
      local_1a8 = (pointer)0x0;
      puStack_1a0 = (pointer)0x0;
      local_198 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      (__return_storage_ptr__->extpubkey_).version_ = local_190;
      (__return_storage_ptr__->extpubkey_).fingerprint_ = uStack_18c;
      (__return_storage_ptr__->extpubkey_).depth_ = uStack_188;
      *(undefined3 *)&(__return_storage_ptr__->extpubkey_).field_0x21 = uStack_187;
      (__return_storage_ptr__->extpubkey_).child_num_ = uStack_184;
      puVar2 = (__return_storage_ptr__->extpubkey_).chaincode_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->extpubkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_180;
      (__return_storage_ptr__->extpubkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_178;
      (__return_storage_ptr__->extpubkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_170;
      local_180 = (pointer)0x0;
      puStack_178 = (pointer)0x0;
      local_170 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      puVar2 = (__return_storage_ptr__->extpubkey_).pubkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->extpubkey_).pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_168;
      *(pointer *)
       ((long)&(__return_storage_ptr__->extpubkey_).pubkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 8) = puStack_160;
      *(pointer *)
       ((long)&(__return_storage_ptr__->extpubkey_).pubkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 0x10) = local_158;
      local_168 = (pointer)0x0;
      puStack_160 = (pointer)0x0;
      local_158 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      puVar2 = (__return_storage_ptr__->extpubkey_).tweak_sum_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->extpubkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_150;
      (__return_storage_ptr__->extpubkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_148;
      (__return_storage_ptr__->extpubkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_140;
      local_150 = (pointer)0x0;
      puStack_148 = (pointer)0x0;
      local_140 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      puVar3 = (__return_storage_ptr__->path_).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->path_).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = local_138;
      (__return_storage_ptr__->path_).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_130;
      (__return_storage_ptr__->path_).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_128;
      local_138 = (pointer)0x0;
      puStack_130 = (pointer)0x0;
      local_128 = (pointer)0x0;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
      }
      puVar2 = (__return_storage_ptr__->fingerprint_).data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->fingerprint_).data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_120;
      (__return_storage_ptr__->fingerprint_).data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_118;
      (__return_storage_ptr__->fingerprint_).data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_110;
      local_120 = (pointer)0x0;
      puStack_118 = (pointer)0x0;
      local_110 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      core::KeyData::~KeyData((KeyData *)local_258);
      if (local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if (local_98.tweak_sum_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.tweak_sum_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_98.pubkey_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.pubkey_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_98.serialize_data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      if (local_98.chaincode_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.chaincode_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
        local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_98.serialize_data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
    }
    if (local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    core::KeyData::GetExtPubkey((ExtPubkey *)local_258,__return_storage_ptr__);
    NVar4 = core::ExtPubkey::GetNetworkType((ExtPubkey *)local_258);
    if (puStack_200 != (pointer)0x0) {
      operator_delete(puStack_200);
    }
    if (puStack_218 != (pointer)0x0) {
      operator_delete(puStack_218);
    }
    if (local_230 != (pointer)0x0) {
      operator_delete(local_230);
    }
    if ((pointer)local_258._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_258._0_8_);
    }
    if ((net_type != kMainnet) == (NVar4 == kMainnet)) {
      local_258._0_8_ = "cfdcapi_psbt.cpp";
      local_258._8_4_ = 0xb9;
      local_258._16_8_ = "ParsePubkey";
      core::logger::log<>((CfdSourceLocation *)local_258,kCfdLogLevelWarning,
                          "unmatch xpubkey network type.");
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      local_258._0_8_ = local_258 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_258,"Failed to parameter. unmatch xpubkey network type.","");
      core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_258);
      __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static KeyData ParsePubkey(int kind, const char* pubkey, NetType net_type) {
  constexpr size_t kCompressPubkeyHexSize = Pubkey::kCompressedPubkeySize * 2;
  std::string pubkey_str(pubkey);

  bool has_extpubkey = false;
  switch (kind) {
    case kCfdPsbtRecordGloalXpub:
      has_extpubkey = true;
      break;
    case kCfdPsbtRecordInputBip32:
    case kCfdPsbtRecordInputSignature:
    case kCfdPsbtRecordOutputBip32:
    default:
      break;
  }

  bool is_pubkey = false;
  if (pubkey_str.length() == kCompressPubkeyHexSize) {
    is_pubkey = true;
  }
  if (is_pubkey == has_extpubkey) {
    warn(CFD_LOG_SOURCE, "unmatch pubkey type.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to parameter. unmatch pubkey type.");
  }

  if (is_pubkey) {
    return KeyData(pubkey_str);
  }
  KeyData data;
  if (pubkey_str.length() == kCfdExtPubkeyHexSize) {
    data = KeyData(ExtPubkey(ByteData(pubkey_str)), "", ByteData());
  } else {
    data = KeyData(ExtPubkey(pubkey_str), "", ByteData());
  }
  bool has_mainnet =
      (data.GetExtPubkey().GetNetworkType() == NetType::kMainnet);

  if (((net_type == NetType::kMainnet) && (!has_mainnet)) ||
      ((net_type != NetType::kMainnet) && (has_mainnet))) {
    warn(CFD_LOG_SOURCE, "unmatch xpubkey network type.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to parameter. unmatch xpubkey network type.");
  }
  return data;
}